

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bits.hpp
# Opt level: O0

uint64_t __thiscall bit_stream::get_int(bit_stream *this,size_t bits)

{
  undefined4 *puVar1;
  uint32_t uVar2;
  long in_RSI;
  undefined8 *in_RDI;
  uint32_t x;
  ulong local_8;
  
  if (in_RSI == 0) {
    local_8 = 0;
  }
  else {
    if (in_RDI[4] == in_RDI[5] + 4) {
      in_RDI[4] = in_RDI[3];
      puVar1 = (undefined4 *)*in_RDI;
      *in_RDI = puVar1 + 1;
      *(undefined4 *)in_RDI[3] = *puVar1;
      in_RDI[8] = in_RDI[8] + 4;
    }
    if ((in_RDI[4] == in_RDI[5]) || (0x20 < (ulong)*(byte *)(in_RDI + 6) + in_RSI)) {
      puVar1 = (undefined4 *)*in_RDI;
      *in_RDI = puVar1 + 1;
      *(undefined4 *)in_RDI[5] = *puVar1;
      in_RDI[8] = in_RDI[8] + 4;
    }
    uVar2 = ::bits::read_int((uint32_t **)(in_RDI + 4),(uint8_t *)(in_RDI + 6),(uint8_t)in_RSI);
    if ((in_RDI[4] == in_RDI[5]) && (*(char *)(in_RDI + 6) != '\0')) {
      in_RDI[4] = in_RDI[3];
      *(undefined4 *)in_RDI[3] = *(undefined4 *)in_RDI[5];
    }
    local_8 = (ulong)uVar2;
  }
  return local_8;
}

Assistant:

uint64_t get_int(size_t bits)
    {
        if (bits == 0)
            return 0;
        if (cur_ptr == last_ptr + 1) {
            cur_ptr = first_ptr;
            *first_ptr = *of++;
            bytes_consumed += sizeof(uint32_t);
        }
        if (cur_ptr == last_ptr || (size_t(in_word_offset) + bits > 32)) {
            *last_ptr = *of++;
            bytes_consumed += sizeof(uint32_t);
        }
        uint32_t x = bits::read_int(cur_ptr, in_word_offset, bits);
        if (cur_ptr == last_ptr && in_word_offset != 0) {
            cur_ptr = first_ptr;
            *first_ptr = *last_ptr;
        }
        return x;
    }